

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O1

bool __thiscall mjs::native_object::delete_property(native_object *this,wstring_view *name)

{
  bool bVar1;
  native_object_property *elem;
  gc_vector<mjs::native_object::native_object_property> *this_00;
  
  elem = find(this,name);
  if (elem == (native_object_property *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = has_attributes(elem->attributes,dont_delete);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
                ::dereference(&this->native_properties_,(this->super_object).heap_);
      gc_vector<mjs::native_object::native_object_property>::erase(this_00,elem);
      bVar1 = true;
    }
  }
  if (elem != (native_object_property *)0x0) {
    return bVar1;
  }
  bVar1 = object::delete_property(&this->super_object,name);
  return bVar1;
}

Assistant:

bool native_object::delete_property(const std::wstring_view& name) {
    if (auto it = find(name)) {
        if (has_attributes(it->attributes, property_attribute::dont_delete)) {
            return false;
        }
        native_properties_.dereference(heap()).erase(it);
        return true;
    }
    return object::delete_property(name);
}